

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O3

void timer_inc(int n,uint32_t clocks,uint32_t remainder)

{
  ushort uVar1;
  gbabus_t *pgVar2;
  gba_interrupt_t gVar3;
  uint uVar4;
  
  uVar4 = bus->TMINT[n].value + clocks;
  if (0xffff < uVar4) {
    do {
      uVar1 = bus->TMCNT_L[n].raw;
      if (n == 3) {
        if (((uint)bus->TMCNT_H[n] & 0x40) != 0) {
          gVar3 = IRQ_TIMER3;
LAB_00105f4e:
          request_interrupt(gVar3);
        }
      }
      else {
        if ((~(uint)bus->TMCNT_H[0] & 0x84) == 0) {
          timer_inc(n + 1,1,0);
        }
        if (((uint)bus->TMCNT_H[n] & 0x40) == 0) {
          if (1 < (uint)n) goto LAB_00105fc2;
        }
        else {
          if (n == 0) {
            gVar3 = IRQ_TIMER0;
          }
          else {
            if (n == 2) {
              gVar3 = IRQ_TIMER2;
              goto LAB_00105f4e;
            }
            if (n != 1) goto LAB_00105fc2;
            gVar3 = IRQ_TIMER1;
          }
          request_interrupt(gVar3);
        }
        sound_timer_overflow(apu,n);
      }
LAB_00105fc2:
      uVar4 = (uVar4 + uVar1) - 0xffff;
    } while (0xffff < uVar4);
  }
  pgVar2 = bus;
  bus->TMINT[n].value = (uint16_t)uVar4;
  pgVar2->TMINT[n].ticks = (uint16_t)remainder;
  return;
}

Assistant:

void timer_inc(int n, word clocks, word remainder) {
    word new_value = bus->TMINT[n].value + clocks;

    while (new_value > 0xFFFF) {
        new_value = bus->TMCNT_L[n].timer_reload + (new_value - 0xFFFF);

        if (n != 3 && bus->TMCNT_H->cascade && bus->TMCNT_H->start) {
            timer_inc(n + 1, 1, 0);
        }

        if (bus->TMCNT_H[n].timer_irq_enable) {
            switch (n) {
                case 0:
                    request_interrupt(IRQ_TIMER0);
                    break;
                case 1:
                    request_interrupt(IRQ_TIMER1);
                    break;
                case 2:
                    request_interrupt(IRQ_TIMER2);
                    break;
                case 3:
                    request_interrupt(IRQ_TIMER3);
                    break;
            }
        }

        if (n == 0 || n == 1) {
            sound_timer_overflow(apu, n);
        }
    }
    bus->TMINT[n].value = new_value;
    bus->TMINT[n].ticks = remainder;
}